

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::ReattemptInitialBroadcast
          (PeerManagerImpl *this,CScheduler *scheduler)

{
  bool bVar1;
  reference puVar2;
  minutes this_00;
  minutes f;
  CTxMemPool *in_RSI;
  uint256 *in_RDI;
  long in_FS_OFFSET;
  uint256 *txid;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *__range1;
  type delta;
  CTransactionRef tx;
  iterator __end1;
  iterator __begin1;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> unbroadcast_txids;
  FastRandomContext *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  FastRandomContext *in_stack_fffffffffffffe58;
  common_type_t<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> in_stack_fffffffffffffe60;
  duration<long,_std::ratio<60L,_1L>_> *in_stack_fffffffffffffe68;
  CTxMemPool *in_stack_fffffffffffffe70;
  CTxMemPool *in_stack_fffffffffffffe90;
  undefined1 unchecked;
  milliseconds delta_00;
  uint256 *in_stack_fffffffffffffed0;
  uint256 *in_stack_fffffffffffffed8;
  PeerManagerImpl *in_stack_fffffffffffffee0;
  uint256 local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CTxMemPool::GetUnbroadcastTxs(in_stack_fffffffffffffe70);
  delta_00.__r = (rep)&local_38;
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::begin
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
             CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::end
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
             CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  while( true ) {
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffe58,
                            (_Self *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar2 = std::_Rb_tree_const_iterator<uint256>::operator*
                       ((_Rb_tree_const_iterator<uint256> *)in_stack_fffffffffffffe48);
    unchecked = (undefined1)((ulong)puVar2 >> 0x38);
    CTxMemPool::get(in_stack_fffffffffffffe90,in_RDI);
    bVar1 = std::operator==((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffe58,
                            (nullptr_t)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50)
                           );
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      CTxMemPool::RemoveUnbroadcastTx(in_RSI,(uint256 *)delta_00.__r,(bool)unchecked);
    }
    else {
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffe48);
      CTransaction::GetWitnessHash((CTransaction *)in_stack_fffffffffffffe48);
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<true> *)in_stack_fffffffffffffe48);
      RelayTransaction(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
                      );
    }
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffe48);
    std::_Rb_tree_const_iterator<uint256>::operator++
              ((_Rb_tree_const_iterator<uint256> *)in_stack_fffffffffffffe48);
  }
  this_00 = min<(char)49,(char)48>();
  FastRandomContext::FastRandomContext(in_stack_fffffffffffffe58,(bool)in_stack_fffffffffffffe57);
  f = min<(char)53>();
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<60l,1l>,void>
            ((duration<long,_std::ratio<1L,_1000L>_> *)
             CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffe48);
  RandomMixin<FastRandomContext>::randrange<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
            ((RandomMixin<FastRandomContext> *)
             CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),in_stack_fffffffffffffe60
            );
  std::chrono::operator+
            (in_stack_fffffffffffffe68,
             (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffe60.__r);
  FastRandomContext::~FastRandomContext(in_stack_fffffffffffffe48);
  std::function<void()>::
  function<(anonymous_namespace)::PeerManagerImpl::ReattemptInitialBroadcast(CScheduler&)::__0,void>
            ((function<void_()> *)in_RSI,
             (anon_class_16_2_5bd75528 *)
             CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  CScheduler::scheduleFromNow((CScheduler *)this_00.__r,(Function *)f.__r,delta_00);
  std::function<void_()>::~function((function<void_()> *)in_stack_fffffffffffffe48);
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::~set
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)in_stack_fffffffffffffe48
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ReattemptInitialBroadcast(CScheduler& scheduler)
{
    std::set<uint256> unbroadcast_txids = m_mempool.GetUnbroadcastTxs();

    for (const auto& txid : unbroadcast_txids) {
        CTransactionRef tx = m_mempool.get(txid);

        if (tx != nullptr) {
            RelayTransaction(txid, tx->GetWitnessHash());
        } else {
            m_mempool.RemoveUnbroadcastTx(txid, true);
        }
    }

    // Schedule next run for 10-15 minutes in the future.
    // We add randomness on every cycle to avoid the possibility of P2P fingerprinting.
    const auto delta = 10min + FastRandomContext().randrange<std::chrono::milliseconds>(5min);
    scheduler.scheduleFromNow([&] { ReattemptInitialBroadcast(scheduler); }, delta);
}